

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChVector.h
# Opt level: O0

ChVector<double> * __thiscall
chrono::ChVector<double>::operator=(ChVector<double> *this,ChVector<double> *other)

{
  ChVector<double> *other_local;
  ChVector<double> *this_local;
  
  if (other != this) {
    this->m_data[0] = other->m_data[0];
    this->m_data[1] = other->m_data[1];
    this->m_data[2] = other->m_data[2];
  }
  return this;
}

Assistant:

inline ChVector<Real>& ChVector<Real>::operator=(const ChVector<Real>& other) {
    if (&other == this)
        return *this;
    m_data[0] = other.m_data[0];
    m_data[1] = other.m_data[1];
    m_data[2] = other.m_data[2];
    return *this;
}